

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool google::protobuf::compiler::anon_unknown_5::ContainsProto3Optional(Descriptor *desc)

{
  byte bVar1;
  FieldDescriptor *pFVar2;
  bool bVar3;
  Nonnull<const_char_*> pcVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  _GLOBAL__N_1 local_40 [16];
  
  bVar6 = 0 < desc->field_count_;
  if (0 < desc->field_count_) {
    lVar7 = 1;
    lVar8 = 0;
    do {
      pFVar2 = desc->fields_;
      if (((&pFVar2->type_)[lVar7] & 1) == 0) {
LAB_001db277:
        if (lVar8 < desc->field_count_) {
          pcVar4 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (lVar8,(long)desc->field_count_,"index < field_count()");
        }
        if (pcVar4 != (Nonnull<const_char_*>)0x0) {
LAB_001db33e:
          _GLOBAL__N_1::ContainsProto3Optional();
LAB_001db34b:
          internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb31);
        }
        bVar1 = (&desc->fields_->super_SymbolBase)[lVar7].symbol_type_;
        if ((bVar1 & 0x10) != 0) {
          if (*(long *)((long)&desc->fields_->containing_type_ + lVar7 + 7) == 0) goto LAB_001db34b;
          if ((bVar1 & 0x10) != 0) {
            if (bVar6) {
              return true;
            }
            break;
          }
        }
      }
      else {
        if (((&pFVar2->super_SymbolBase)[lVar7].symbol_type_ & 0x10) == 0) {
          lVar5 = 0;
        }
        else {
          lVar5 = *(long *)((long)&pFVar2->containing_type_ + lVar7 + 7);
          if (lVar5 == 0) goto LAB_001db34b;
        }
        if (lVar5 == 0) {
          internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb63);
        }
        if ((*(int *)(lVar5 + 4) == 1) && ((*(byte *)(*(long *)(lVar5 + 0x30) + 1) & 2) != 0)) {
          _GLOBAL__N_1::ContainsProto3Optional(local_40);
          goto LAB_001db33e;
        }
        if (((&pFVar2->type_)[lVar7] & 1) == 0) goto LAB_001db277;
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x58;
      bVar6 = lVar8 < desc->field_count_;
    } while (lVar8 < desc->field_count_);
  }
  bVar6 = 0 < desc->nested_type_count_;
  if ((0 < desc->nested_type_count_) &&
     (bVar3 = ContainsProto3Optional(desc->nested_types_), !bVar3)) {
    lVar8 = 0;
    lVar7 = 0xa0;
    do {
      lVar8 = lVar8 + 1;
      bVar6 = lVar8 < desc->nested_type_count_;
      if (desc->nested_type_count_ <= lVar8) {
        return bVar6;
      }
      bVar3 = ContainsProto3Optional((Descriptor *)(&desc->nested_types_->super_SymbolBase + lVar7))
      ;
      lVar7 = lVar7 + 0xa0;
    } while (!bVar3);
  }
  return bVar6;
}

Assistant:

bool ContainsProto3Optional(const Descriptor* desc) {
  for (int i = 0; i < desc->field_count(); ++i) {
    if (desc->field(i)->real_containing_oneof() == nullptr &&
        desc->field(i)->containing_oneof() != nullptr) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); ++i) {
    if (ContainsProto3Optional(desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}